

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O2

void __thiscall M_tree::insert_leaf(M_tree *this,string *key,int n)

{
  const_iterator __position;
  uint uVar1;
  Node *pNVar2;
  Node *pNVar3;
  pointer pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  bool bVar7;
  ostream *poVar8;
  Node *pNVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Node *pNVar13;
  ulong uVar14;
  Node *item;
  hash_add_key result;
  uint32_t newhash [8];
  ifstream file;
  uint32_t in_stack_ffffffffffeffdc8;
  char byte_file [1048576];
  
  if (n == 1) {
    uVar10 = (ulong)((long)(this->file_names_p).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->file_names_p).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5;
    uVar14 = 0;
    uVar11 = uVar10 & 0xffffffff;
    if ((int)uVar10 < 1) {
      uVar11 = uVar14;
    }
    for (; uVar14 != uVar11; uVar14 = uVar14 + 1) {
      bVar7 = std::operator<(key,(this->file_names_p).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar14);
      if (bVar7) {
        item = (Node *)operator_new(0x50);
        (item->key).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (item->key).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (item->key).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        item->hashn[0] = 0;
        item->hashn[1] = 0;
        item->hashn[2] = 0;
        item->hashn[3] = 0;
        item->hashn[4] = 0;
        item->hashn[5] = 0;
        item->hashn[6] = 0;
        item->hashn[7] = 0;
        item->parent = (Node *)0x0;
        item->left = (Node *)0x0;
        item->right = (Node *)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)item,key);
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffeffd80,(string *)&this->folder_name1);
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffeffd60,"/",(allocator *)&stack0xffffffffffeffc87);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffeffda0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffeffd80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffeffd60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffeffda0,key);
        std::ifstream::ifstream(&file,(char *)result._0_8_,_S_in|_S_bin);
        std::__cxx11::string::~string((string *)result.ahash);
        std::__cxx11::string::~string((string *)&stack0xffffffffffeffda0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffeffd60);
        std::__cxx11::string::~string((string *)&stack0xffffffffffeffd80);
        uVar1 = *(uint *)(&stack0xffffffffffeffde0 + *(long *)(_file + -0x18));
        if ((uVar1 & 5) == 0) {
          memset(byte_file,0,0x100000);
          std::istream::read((char *)&file,(long)byte_file);
          poVar8 = std::operator<<((ostream *)&std::cout,"inserting the file: ");
          poVar8 = std::operator<<(poVar8,(string *)key);
          std::endl<char,std::char_traits<char>>(poVar8);
          sha256((uint8_t *)byte_file,in_stack_ffffffffffeffdc8,item->hashn);
          std::ifstream::close();
          __position._M_current =
               (this->point_p).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
          pNVar2 = *__position._M_current;
          std::vector<Node_*,_std::allocator<Node_*>_>::insert(&this->point_p,__position,&item);
          pNVar13 = pNVar2->parent;
          pNVar9 = pNVar13->left;
          pNVar3 = pNVar13->right;
          if (pNVar9 == pNVar2) {
            if (pNVar3 != (Node *)0x0) {
              if (pNVar9 != (Node *)0x0 || pNVar3 != pNVar2) {
                pNVar9 = (Node *)operator_new(0x50);
                pNVar9->hashn[6] = 0;
                pNVar9->hashn[7] = 0;
                pNVar9->parent = (Node *)0x0;
                pNVar9->hashn[2] = 0;
                pNVar9->hashn[3] = 0;
                pNVar9->hashn[4] = 0;
                pNVar9->hashn[5] = 0;
                (pNVar9->key).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pNVar9->hashn[0] = 0;
                pNVar9->hashn[1] = 0;
                (pNVar9->key).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (pNVar9->key).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                pNVar9->left = item;
                pNVar9->right = pNVar2;
                item->parent = pNVar9;
                pNVar13 = pNVar2->parent;
                pNVar2->parent = pNVar9;
                pNVar13->left = pNVar9;
                item = pNVar9;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pNVar9,(pNVar9->left->key).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                           (pNVar9->left->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                lVar12 = 0;
                uVar10 = 0;
                while( true ) {
                  pNVar2 = item->right;
                  pbVar4 = (pNVar2->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)((long)(pNVar2->key).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5)
                      <= uVar10) break;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&item->key,(value_type *)((long)&(pbVar4->_M_dataplus)._M_p + lVar12))
                  ;
                  uVar10 = uVar10 + 1;
                  lVar12 = lVar12 + 0x20;
                }
                pNVar9 = item->left;
                result._0_8_ = *(undefined8 *)pNVar9->hashn;
                result._8_8_ = *(undefined8 *)(pNVar9->hashn + 2);
                result._16_8_ = *(undefined8 *)(pNVar9->hashn + 4);
                result._24_8_ = *(undefined8 *)(pNVar9->hashn + 6);
                result._32_8_ = *(undefined8 *)pNVar2->hashn;
                result._40_8_ = *(undefined8 *)(pNVar2->hashn + 2);
                result._48_8_ = *(undefined8 *)(pNVar2->hashn + 4);
                result._56_8_ = *(undefined8 *)(pNVar2->hashn + 6);
                sha256(&stack0xffffffffffeffce8,0x40,newhash);
                goto LAB_00104213;
              }
              goto LAB_0010409b;
            }
            pNVar13->right = item;
LAB_0010411d:
            item->parent = pNVar13;
            item = pNVar13;
          }
          else {
            if (pNVar9 == (Node *)0x0 && pNVar3 == pNVar2) {
LAB_0010409b:
              pNVar13->left = item;
              goto LAB_0010411d;
            }
            pNVar9 = (Node *)operator_new(0x50);
            pNVar9->hashn[6] = 0;
            pNVar9->hashn[7] = 0;
            pNVar9->parent = (Node *)0x0;
            pNVar9->hashn[2] = 0;
            pNVar9->hashn[3] = 0;
            pNVar9->hashn[4] = 0;
            pNVar9->hashn[5] = 0;
            (pNVar9->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pNVar9->hashn[0] = 0;
            pNVar9->hashn[1] = 0;
            (pNVar9->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pNVar9->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pNVar9->left = item;
            pNVar9->right = pNVar2;
            item->parent = pNVar9;
            pNVar13 = pNVar2->parent;
            pNVar2->parent = pNVar9;
            pNVar13->right = pNVar9;
            pvVar5 = &item->key;
            pvVar6 = &item->key;
            item = pNVar9;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar9,
                       (pvVar5->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (pvVar6->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
            lVar12 = 0;
            uVar10 = 0;
            while( true ) {
              pNVar2 = item->right;
              pbVar4 = (pNVar2->key).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pNVar2->key).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <=
                  uVar10) break;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&item->key,(value_type *)((long)&(pbVar4->_M_dataplus)._M_p + lVar12));
              uVar10 = uVar10 + 1;
              lVar12 = lVar12 + 0x20;
            }
            pNVar9 = item->left;
            result._0_8_ = *(undefined8 *)pNVar9->hashn;
            result._8_8_ = *(undefined8 *)(pNVar9->hashn + 2);
            result._16_8_ = *(undefined8 *)(pNVar9->hashn + 4);
            result._24_8_ = *(undefined8 *)(pNVar9->hashn + 6);
            result._32_8_ = *(undefined8 *)pNVar2->hashn;
            result._40_8_ = *(undefined8 *)(pNVar2->hashn + 2);
            result._48_8_ = *(undefined8 *)(pNVar2->hashn + 4);
            result._56_8_ = *(undefined8 *)(pNVar2->hashn + 6);
            sha256(&stack0xffffffffffeffce8,0x40,newhash);
LAB_00104213:
            *(undefined8 *)(item->hashn + 4) = newhash._16_8_;
            *(undefined8 *)(item->hashn + 6) = newhash._24_8_;
            *(undefined8 *)item->hashn = newhash._0_8_;
            *(undefined8 *)(item->hashn + 2) = newhash._8_8_;
            item = pNVar13;
          }
          for (; item != (Node *)0x0; item = item->parent) {
            pNVar2 = item->left;
            pNVar13 = item->right;
            if (pNVar13 == (Node *)0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)item,
                         (pNVar2->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pNVar2->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
LAB_0010433f:
              sha256(&stack0xffffffffffeffce8,0x40,newhash);
            }
            else {
              if (pNVar2 == (Node *)0x0) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)item
                           ,(pNVar13->key).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                           (pNVar13->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                goto LAB_0010433f;
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)item,
                         (pNVar2->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pNVar2->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              lVar12 = 0;
              uVar10 = 0;
              while( true ) {
                pNVar2 = item->right;
                pbVar4 = (pNVar2->key).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(pNVar2->key).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <=
                    uVar10) break;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&item->key,(value_type *)((long)&(pbVar4->_M_dataplus)._M_p + lVar12));
                uVar10 = uVar10 + 1;
                lVar12 = lVar12 + 0x20;
              }
              pNVar13 = item->left;
              result._0_8_ = *(undefined8 *)pNVar13->hashn;
              result._8_8_ = *(undefined8 *)(pNVar13->hashn + 2);
              result._16_8_ = *(undefined8 *)(pNVar13->hashn + 4);
              result._24_8_ = *(undefined8 *)(pNVar13->hashn + 6);
              result._32_8_ = *(undefined8 *)pNVar2->hashn;
              result._40_8_ = *(undefined8 *)(pNVar2->hashn + 2);
              result._48_8_ = *(undefined8 *)(pNVar2->hashn + 4);
              result._56_8_ = *(undefined8 *)(pNVar2->hashn + 6);
              sha256(&stack0xffffffffffeffce8,0x40,newhash);
            }
            *(undefined8 *)(item->hashn + 4) = newhash._16_8_;
            *(undefined8 *)(item->hashn + 6) = newhash._24_8_;
            *(undefined8 *)item->hashn = newhash._0_8_;
            *(undefined8 *)(item->hashn + 2) = newhash._8_8_;
          }
        }
        else {
          poVar8 = std::operator<<((ostream *)&std::cout,"Failed open the file");
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffeffd80,(string *)&this->folder_name1);
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffeffd60,"/",(allocator *)&stack0xffffffffffeffc87);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffeffda0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffeffd80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffeffd60);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&stack0xffffffffffeffda0,key);
          poVar8 = std::operator<<(poVar8,(string *)result.ahash);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::string::~string((string *)result.ahash);
          std::__cxx11::string::~string((string *)&stack0xffffffffffeffda0);
          std::__cxx11::string::~string((string *)&stack0xffffffffffeffd60);
          std::__cxx11::string::~string((string *)&stack0xffffffffffeffd80);
        }
        std::ifstream::~ifstream(&file);
        if ((uVar1 & 5) == 0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void M_tree::insert_leaf(string key, int n) {
    char byte_file[1024*1024];
    Node * item;
    Node * item2;
    Node * leaff;
    Node * up;
    uint32_t newhash[8];
    hash_add_key hasha;
    switch (n) {
        case 1:
        {
            int n = file_names_p.size();
            for(int i=0;i<n;i++){
                if(key < file_names_p[i]){
                    // finish insert
                    item = new(Node);
                    item->right = NULL;
                    item->left = NULL;
                    item->key.push_back(key);
                    ifstream file((string(folder_name1)+string("/")+key).c_str(), ios::in | ios::binary);
                    if(!file){
                        cout << "Failed open the file" << string(folder_name1)+string("/")+key << endl;
                        continue;
                    }
                    memset(byte_file, 0, sizeof(byte_file));
                    file.read(reinterpret_cast<char *>(&byte_file), sizeof(byte_file));
                    cout << "inserting the file: " << key << endl;                //output the file names
                    sha256((uint8_t*)byte_file,file.gcount(), item->hashn);
                    file.close();
                    leaff = point_p[i];
                    point_p.insert(point_p.begin()+i, item);
                    if(leaff->parent->left == leaff && leaff->parent->right == NULL){
                        leaff->parent->right = item;
                        item->parent = leaff->parent;
                        item = item->parent;
                    }
                    else if(leaff->parent->right == leaff && leaff->parent->left == NULL){
                        leaff->parent->left = item;
                        item->parent = leaff->parent;
                        item = item->parent;
                    }
                    else{
                        if(leaff->parent->left == leaff){
                            item2 = new(Node);
                            item2->left = item;
                            item2->right = leaff;
                            item->parent = item2;
                            item = item2;
                            item2 = leaff->parent;
                            leaff->parent = item;
                            item2->left = item;
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                            item = item2;
                        }
                        else{
                            item2 = new(Node);
                            item2->left = item;
                            item2->right = leaff;
                            item->parent = item2;
                            item = item2;
                            item2 = leaff->parent;
                            leaff->parent = item;
                            item2->right = item;
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                            item = item2;
                        }
                    }
                    // start update hash and keys
                    while (item!=NULL){
                        if(item->right == NULL){
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            memcpy(hasha.ahash2, item->left->hashn, 32);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        else if(item->left == NULL){
                            item->key.assign(item->right->key.begin(), item->right->key.end());
                            memcpy(hasha.ahash2, item->right->hashn, 32);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        else{
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        item = item->parent;
                    }
                    return;
                }
            }
            break;
        }
        default:{
            return;
        }
    }
}